

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptSymbol * __thiscall
Js::JavascriptLibrary::CreateSymbol
          (JavascriptLibrary *this,char16 *description,int descriptionLength)

{
  JavascriptSymbol *pJVar1;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  EnterPinnedScope(&local_30);
  local_30 = ThreadContext::UncheckedAddPropertyId
                       (((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext,
                        description,descriptionLength,false,true);
  LeavePinnedScope();
  pJVar1 = CreateSymbol(this,local_30);
  return pJVar1;
}

Assistant:

JavascriptSymbol* JavascriptLibrary::CreateSymbol(const char16* description, int descriptionLength)
    {
        ENTER_PINNED_SCOPE(const Js::PropertyRecord, propertyRecord);

        propertyRecord = this->scriptContext->GetThreadContext()->UncheckedAddPropertyId(description, descriptionLength, /*bind*/false, /*isSymbol*/true);

        LEAVE_PINNED_SCOPE();

        return this->CreateSymbol(propertyRecord);
    }